

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

string * intgemm::PrintMatrix<signed_char>
                   (string *__return_storage_ptr__,char *mem,Index rows,Index cols)

{
  Index IVar1;
  ostream *poVar2;
  ulong uVar3;
  bool bVar4;
  ostringstream out;
  undefined8 auStack_198 [45];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  IVar1 = 0;
  while( true ) {
    uVar3 = (ulong)cols;
    if (IVar1 == rows) break;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      *(undefined8 *)((long)auStack_198 + *(long *)(_out + -0x18)) = 4;
      poVar2 = std::ostream::_M_insert<long>((long)&out);
      std::operator<<(poVar2,' ');
    }
    std::operator<<((ostream *)&out,'\n');
    IVar1 = IVar1 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintMatrix(const Type *mem, Index rows, Index cols) {
  std::ostringstream out;
  for (Index r = 0; r < rows; ++r) {
    for (Index c = 0; c < cols; ++c) {
      out << std::setw(4) << (int64_t) mem[r * cols + c] << ' ';
    }
    out << '\n';
  }
  return out.str();
}